

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O0

void remove_dangling_links(ps_lattice_t *dag,ps_latnode_t *node)

{
  latlink_list_t *plVar1;
  latlink_list_t *next_x;
  latlink_list_t *prev_x;
  latlink_list_t *x;
  ps_latnode_t *node_local;
  ps_lattice_t *dag_local;
  
  next_x = (latlink_list_t *)0x0;
  prev_x = node->exits;
  while (prev_x != (latlink_list_t *)0x0) {
    plVar1 = prev_x->next;
    if (prev_x->link->to == (ps_latnode_s *)0x0) {
      if (next_x == (latlink_list_t *)0x0) {
        node->exits = plVar1;
      }
      else {
        next_x->next = plVar1;
      }
      __listelem_free__(dag->latlink_alloc,prev_x->link,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                        ,0x95);
      __listelem_free__(dag->latlink_list_alloc,prev_x,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                        ,0x96);
      prev_x = plVar1;
    }
    else {
      next_x = prev_x;
      prev_x = plVar1;
    }
  }
  next_x = (latlink_list_t *)0x0;
  prev_x = node->entries;
  while (prev_x != (latlink_list_t *)0x0) {
    plVar1 = prev_x->next;
    if (prev_x->link->from == (ps_latnode_s *)0x0) {
      if (next_x == (latlink_list_t *)0x0) {
        node->entries = plVar1;
      }
      else {
        next_x->next = plVar1;
      }
      __listelem_free__(dag->latlink_alloc,prev_x->link,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                        ,0xa3);
      __listelem_free__(dag->latlink_list_alloc,prev_x,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                        ,0xa4);
      prev_x = plVar1;
    }
    else {
      next_x = prev_x;
      prev_x = plVar1;
    }
  }
  return;
}

Assistant:

static void
remove_dangling_links(ps_lattice_t *dag, ps_latnode_t *node)
{
    latlink_list_t *x, *prev_x, *next_x;

    prev_x = NULL;
    for (x = node->exits; x; x = next_x) {
        next_x = x->next;
        if (x->link->to == NULL) {
            if (prev_x)
                prev_x->next = next_x;
            else
                node->exits = next_x;
            listelem_free(dag->latlink_alloc, x->link);
            listelem_free(dag->latlink_list_alloc, x);
        }
        else
            prev_x = x;
    }
    prev_x = NULL;
    for (x = node->entries; x; x = next_x) {
        next_x = x->next;
        if (x->link->from == NULL) {
            if (prev_x)
                prev_x->next = next_x;
            else
                node->entries = next_x;
            listelem_free(dag->latlink_alloc, x->link);
            listelem_free(dag->latlink_list_alloc, x);
        }
        else
            prev_x = x;
    }
}